

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImRect IVar3;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if (((((window_00->Appearing & 1U) != 0) && (GImGui->NavWindow == window_00->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (window_00->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar1->NavInitResultId = (pIVar1->LastItemData).ID;
    IVar3 = WindowRectAbsToRel(window_00,&(pIVar1->LastItemData).Rect);
    local_28 = IVar3.Min;
    (pIVar1->NavInitResultRectRel).Min = local_28;
    local_20 = IVar3.Max;
    (pIVar1->NavInitResultRectRel).Max = local_20;
    NavUpdateAnyRequestFlag();
    bVar2 = IsItemVisible();
    if (!bVar2) {
      ScrollToRectEx(window_00,&(pIVar1->LastItemData).Rect,0);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResultId == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    g.NavInitResultId = g.LastItemData.ID;
    g.NavInitResultRectRel = WindowRectAbsToRel(window, g.LastItemData.Rect);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via a opt-in flag (we however don't want regular init requests to scroll)
    if (!IsItemVisible())
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}